

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.cpp
# Opt level: O1

void arrays(void)

{
  rtosc_print_options shortline;
  rtosc_print_options local_18;
  
  check_alt("[0 1 2]",(rtosc_print_options *)0x0,"simple integer array",0x122,(char *)0x0);
  check_alt("[]",(rtosc_print_options *)0x0,"empty array",0x123,(char *)0x0);
  local_18.lossless = true;
  local_18.floating_point_precision = 3;
  local_18.sep = " ";
  local_18.linelength = 0xc;
  local_18.compress_ranges = 1;
  check_alt("[\"123\" \"45\" \"\"\\\n    \"6\"]",&local_18,"array with linebreak",0x129,(char *)0x0)
  ;
  check_alt("[1 2 3] [\'a\' \'b\'] [] [\"Hello World\"]",(rtosc_print_options *)0x0,
            "Consecutive arrays",300,(char *)0x0);
  check_alt("[[0 1] [] [2 3]]",(rtosc_print_options *)0x0,"arrays inside arrays",0x12e,(char *)0x0);
  check_alt("[true false]",(rtosc_print_options *)0x0,"true and false have the same type",0x130,
            (char *)0x0);
  check_alt("[0.00 (0x0p+0) 0.07 (0x1.242124p-4) 0.07 (0x1.242124p-4) ... ]",
            (rtosc_print_options *)0x0,"array of floats",0x133,(char *)0x0);
  return;
}

Assistant:

void arrays()
{
    check("[0 1 2]", NULL, "simple integer array", __LINE__);
    check("[]", NULL, "empty array", __LINE__);

    auto shortline = make_print_options(true, 3, " ", 12, true);
    // TODO: arrays with strings print newline positions wrong
    //       write *one* generic function rtosc_insert_newlines?
    check("[\"123\" \"45\" \"\"\\\n    \"6\"]", &shortline,
          "array with linebreak", __LINE__);

    check("[1 2 3] ['a' 'b'] [] [\"Hello World\"]", NULL,
          "Consecutive arrays", __LINE__);

    check("[[0 1] [] [2 3]]", NULL, "arrays inside arrays", __LINE__);

    check("[true false]", NULL, "true and false have the same type", __LINE__);

    check("[0.00 (0x0p+0) 0.07 (0x1.242124p-4) 0.07 (0x1.242124p-4) ... ]",
          NULL, "array of floats", __LINE__);
}